

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX.h
# Opt level: O1

void __thiscall
Screen_Manager::Screen_Info::Screen_Info
          (Screen_Info *this,char *_name,Display *_dpy,Am_Drawonable *_draw)

{
  size_t sVar1;
  char *__dest;
  
  if (_name == (char *)0x0) {
    this->name = (char *)0x0;
  }
  else {
    sVar1 = strlen(_name);
    __dest = (char *)operator_new__(sVar1 + 1);
    this->name = __dest;
    strcpy(__dest,_name);
  }
  this->dpy = _dpy;
  this->draw = _draw;
  return;
}

Assistant:

Screen_Info(const char *_name, Display *_dpy, Am_Drawonable *_draw)
    {
      if (_name) {
        name = new char[strlen(_name) + 1];
        strcpy(name, _name);
      } else
        name = nullptr;
      dpy = _dpy;
      draw = _draw;
    }